

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O0

Error uv11::read_start(Stream *stream,AllocCb *alloc_cb,ReadCb *read_cb)

{
  uv_stream_t *puVar1;
  _func_void_uv_handle_t_ptr_size_t_uv_buf_t_ptr *p_Var2;
  _func_void_uv_stream_t_ptr_ssize_t_uv_buf_t_ptr *p_Var3;
  error_code eVar4;
  Error EVar5;
  __1 local_36;
  __0 local_35;
  int local_34;
  ReadCb *pRStack_30;
  int s;
  ReadCb *read_cb_local;
  AllocCb *alloc_cb_local;
  Stream *stream_local;
  
  pRStack_30 = read_cb;
  read_cb_local = (ReadCb *)alloc_cb;
  alloc_cb_local = (AllocCb *)stream;
  std::function<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*)>::operator=
            (&(stream->super_Handle).on_alloc,alloc_cb);
  std::function<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code)>::operator=
            ((function<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code)> *)
             &alloc_cb_local[2]._M_invoker,pRStack_30);
  puVar1 = Stream::GetStream((Stream *)alloc_cb_local);
  p_Var2 = read_start(uv11::Stream&,std::function_const&,std::function_const&)::$_0::
           operator_cast_to_function_pointer(&local_35);
  p_Var3 = read_start(uv11::Stream&,std::function_const&,std::function_const&)::$_1::
           operator_cast_to_function_pointer(&local_36);
  local_34 = uv_read_start(puVar1,p_Var2,p_Var3);
  if (local_34 != 0) {
    std::function<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*)>::operator=
              ((function<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*)> *)
               ((long)&(alloc_cb_local->super__Function_base)._M_functor + 8),(nullptr_t)0x0);
    std::function<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code)>::operator=
              ((function<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code)> *)
               &alloc_cb_local[2]._M_invoker,(nullptr_t)0x0);
  }
  eVar4 = make_error(local_34);
  EVar5._M_cat = eVar4._M_cat;
  EVar5._M_value = eVar4._M_value;
  EVar5._4_4_ = 0;
  return EVar5;
}

Assistant:

Error uv11::read_start(Stream& stream, AllocCb const& alloc_cb, ReadCb const& read_cb) {
    stream.on_alloc = alloc_cb;
    stream.on_read = read_cb;

    int s = ::uv_read_start(
        &stream.GetStream(),
        [](uv_handle_t* handle, ::size_t suggested_size, ::uv_buf_t* buf) {
            Handle* h = reinterpret_cast<Handle*>(handle->data);
            return h->on_alloc(*h, suggested_size, buf);
        },
        [](uv_stream_t* stream_ptr, ::ssize_t nread, ::uv_buf_t const* buf){
            Stream* strm = reinterpret_cast<Stream*>(stream_ptr->data);
            // FIXME: How do we handle errors - i.e. if nread < 0
            if (nread >= 0) {
                return strm->on_read(
                    *strm,
                    *buf,
                    nread,
                    make_error(0)
                );
            } else {
                return strm->on_read(
                    *strm,
                    *buf,
                    0,
                    make_error(static_cast<int>(nread))
                );
            }
        }
    );

    if (s) {
        stream.on_alloc = nullptr;
        stream.on_read = nullptr;
    }

    return make_error(s);
}